

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::FixOptionsForEnum
          (Generator *this,EnumDescriptor *enum_descriptor)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  EnumDescriptor *in_RSI;
  string value_options;
  EnumValueDescriptor *value_descriptor;
  int i;
  string enum_options;
  string descriptor_name;
  string *in_stack_fffffffffffffec8;
  string *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  int iVar4;
  string local_e8 [32];
  string local_c8 [8];
  string *in_stack_ffffffffffffff40;
  Generator *in_stack_ffffffffffffff48;
  string local_a8 [32];
  EnumValueDescriptor *local_88;
  int local_80;
  string local_70 [32];
  string local_50 [8];
  EnumDescriptor *in_stack_ffffffffffffffc0;
  Generator *in_stack_ffffffffffffffc8;
  string local_30 [32];
  EnumDescriptor *local_10;
  
  local_10 = in_RSI;
  ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  EnumDescriptor::options(local_10);
  MessageLite::SerializeAsString_abi_cxx11_
            ((MessageLite *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  OptionsValue(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::__cxx11::string::~string(local_70);
  bVar1 = std::operator!=(in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
  if (bVar1) {
    anon_unknown_0::PrintDescriptorOptionsFixingCode
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,(Printer *)0x4c50bc);
  }
  local_80 = 0;
  while (iVar4 = local_80, iVar2 = EnumDescriptor::value_count(local_10), iVar4 < iVar2) {
    local_88 = EnumDescriptor::value(local_10,local_80);
    EnumValueDescriptor::options(local_88);
    MessageLite::SerializeAsString_abi_cxx11_
              ((MessageLite *)CONCAT44(iVar4,in_stack_fffffffffffffef8));
    OptionsValue(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    std::__cxx11::string::~string(local_c8);
    bVar1 = std::operator!=(in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
    if (bVar1) {
      in_stack_fffffffffffffed0 = (string *)std::__cxx11::string::c_str();
      EnumValueDescriptor::name_abi_cxx11_(local_88);
      uVar3 = std::__cxx11::string::c_str();
      StringPrintf_abi_cxx11_
                ((char *)local_e8,"%s.values_by_name[\"%s\"]",in_stack_fffffffffffffed0,uVar3);
      anon_unknown_0::PrintDescriptorOptionsFixingCode
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,(Printer *)0x4c5250);
      std::__cxx11::string::~string(local_e8);
    }
    std::__cxx11::string::~string(local_a8);
    local_80 = local_80 + 1;
  }
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void Generator::FixOptionsForEnum(const EnumDescriptor& enum_descriptor) const {
  std::string descriptor_name = ModuleLevelDescriptorName(enum_descriptor);
  std::string enum_options =
      OptionsValue(enum_descriptor.options().SerializeAsString());
  if (enum_options != "None") {
    PrintDescriptorOptionsFixingCode(descriptor_name, enum_options, printer_);
  }
  for (int i = 0; i < enum_descriptor.value_count(); ++i) {
    const EnumValueDescriptor& value_descriptor = *enum_descriptor.value(i);
    std::string value_options =
        OptionsValue(value_descriptor.options().SerializeAsString());
    if (value_options != "None") {
      PrintDescriptorOptionsFixingCode(
          StringPrintf("%s.values_by_name[\"%s\"]", descriptor_name.c_str(),
                       value_descriptor.name().c_str()),
          value_options, printer_);
    }
  }
}